

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

void MatchFinder_Construct(CMatchFinder *p)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  
  p->bufferBase = (Byte *)0x0;
  p->directInput = '\0';
  p->hash = (CLzRef *)0x0;
  p->cutValue = 0x20;
  p->btMode = '\x01';
  p->bigHash = '\0';
  p->numHashBytes = 4;
  for (uVar1 = 0; uVar1 != 0x100; uVar1 = uVar1 + 1) {
    iVar3 = 8;
    uVar2 = uVar1 & 0xffffffff;
    while( true ) {
      bVar4 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar4) break;
      uVar2 = (ulong)(-((uint)uVar2 & 1) & 0xedb88320 ^ (uint)(uVar2 >> 1));
    }
    p->crc[uVar1] = (uint)uVar2;
  }
  return;
}

Assistant:

void MatchFinder_Construct(CMatchFinder *p)
{
  UInt32 i;
  p->bufferBase = NULL;
  p->directInput = 0;
  p->hash = NULL;
  MatchFinder_SetDefaultSettings(p);

  for (i = 0; i < 256; i++)
  {
    UInt32 r = i;
    unsigned j;
    for (j = 0; j < 8; j++)
      r = (r >> 1) ^ (kCrcPoly & ~((r & 1) - 1));
    p->crc[i] = r;
  }
}